

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::setVideoMode(WindowImplX11 *this,VideoMode *mode)

{
  RRCrtc RVar1;
  bool bVar2;
  XRRScreenResources *res;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int i;
  long lVar8;
  char *pcVar9;
  XRRModeInfo *pXVar10;
  uint uVar11;
  int xRandRMinor;
  int xRandRMajor;
  RROutput output;
  Window rootWindow;
  uint local_30;
  
  _rootWindow = VideoMode::getDesktopMode();
  bVar2 = operator==(mode,(VideoMode *)&rootWindow);
  if (bVar2) {
    return;
  }
  bVar2 = checkXRandR(this,&xRandRMajor,&xRandRMinor);
  if (bVar2) {
    rootWindow = *(undefined8 *)
                  (*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80);
    res = (XRRScreenResources *)XRRGetScreenResources();
    if (res == (XRRScreenResources *)0x0) {
      poVar4 = err();
      pcVar9 = 
      "Failed to get the current screen resources for fullscreen mode, switching to window mode";
    }
    else {
      output = getOutputPrimary(this,&rootWindow,res,xRandRMajor,xRandRMinor);
      lVar3 = XRRGetOutputInfo(this->m_display,res,output);
      if (lVar3 == 0) {
        XRRFreeScreenResources(res);
      }
      else {
        if (*(short *)(lVar3 + 0x30) != 1) {
          lVar5 = XRRGetCrtcInfo(this->m_display,res,*(undefined8 *)(lVar3 + 8));
          if (lVar5 == 0) {
            XRRFreeScreenResources(res);
            XRRFreeOutputInfo(lVar3);
            poVar4 = err();
            pcVar9 = "Failed to get crtc info for fullscreen mode, switching to window mode";
          }
          else {
            lVar7 = 0;
            lVar8 = 0;
            bVar2 = false;
            lVar6 = lVar5;
            while ((lVar8 < res->nmode && (!bVar2))) {
              if ((*(short *)(lVar5 + 0x20) == 2) || (*(short *)(lVar5 + 0x20) == 8)) {
                pXVar10 = res->modes;
                uVar11 = *(uint *)((long)&pXVar10->height + lVar7);
                *(undefined4 *)((long)&pXVar10->height + lVar7) =
                     *(undefined4 *)((long)&pXVar10->width + lVar7);
                *(uint *)((long)&pXVar10->width + lVar7) = uVar11;
              }
              else {
                pXVar10 = res->modes;
                uVar11 = *(uint *)((long)&pXVar10->width + lVar7);
              }
              if ((uVar11 == mode->width) &&
                 (*(uint *)((long)&pXVar10->height + lVar7) == mode->height)) {
                lVar6 = *(long *)((long)&pXVar10->id + lVar7);
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
              lVar8 = lVar8 + 1;
              lVar7 = lVar7 + 0x50;
            }
            if (bVar2) {
              this->m_oldVideoMode = *(int *)(lVar5 + 0x18);
              RVar1 = *(RRCrtc *)(lVar3 + 8);
              this->m_oldRRCrtc = RVar1;
              XRRSetCrtcConfig(this->m_display,res,RVar1,0,*(undefined4 *)(lVar5 + 8),
                               *(undefined4 *)(lVar5 + 0xc),lVar6,*(undefined2 *)(lVar5 + 0x20),
                               &output,1);
              (anonymous_namespace)::fullscreenWindow = this;
              XRRFreeScreenResources(res);
              XRRFreeOutputInfo(lVar3);
              XRRFreeCrtcInfo(lVar5);
              return;
            }
            XRRFreeScreenResources(res);
            XRRFreeOutputInfo(lVar3);
            poVar4 = err();
            pcVar9 = 
            "Failed to find a matching RRMode for fullscreen mode, switching to window mode";
          }
          goto LAB_0013609d;
        }
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(lVar3);
      }
      poVar4 = err();
      pcVar9 = "Failed to get output info for fullscreen mode, switching to window mode";
    }
  }
  else {
    poVar4 = err();
    pcVar9 = "Fullscreen is not supported, switching to window mode";
  }
LAB_0013609d:
  poVar4 = std::operator<<(poVar4,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void WindowImplX11::setVideoMode(const VideoMode& mode)
{
    // Skip mode switching if the new mode is equal to the desktop mode
    if (mode == VideoMode::getDesktopMode())
        return;

    // Check if the XRandR extension is present
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
    {
        // XRandR extension is not supported: we cannot use fullscreen mode
        err() << "Fullscreen is not supported, switching to window mode" << std::endl;
        return;
    }

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Find RRMode to set
    bool modeFound = false;
    RRMode xRandMode;

    for (int i = 0; (i < res->nmode) && !modeFound; i++)
    {
        if (crtcInfo->rotation == RR_Rotate_90 || crtcInfo->rotation == RR_Rotate_270)
            std::swap(res->modes[i].height, res->modes[i].width);

        // Check if screen size match
        if (res->modes[i].width == static_cast<int>(mode.width) &&
            res->modes[i].height == static_cast<int>(mode.height))
        {
            xRandMode = res->modes[i].id;
            modeFound = true;
        }
    }

    if (!modeFound)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to find a matching RRMode for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Save the current video mode before we switch to fullscreen
    m_oldVideoMode = crtcInfo->mode;
    m_oldRRCrtc = outputInfo->crtc;

    // Switch to fullscreen mode
    XRRSetCrtcConfig(m_display,
                     res,
                     outputInfo->crtc,
                     CurrentTime,
                     crtcInfo->x,
                     crtcInfo->y,
                     xRandMode,
                     crtcInfo->rotation,
                     &output,
                     1);

    // Set "this" as the current fullscreen window
    fullscreenWindow = this;

    XRRFreeScreenResources(res);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeCrtcInfo(crtcInfo);
}